

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void kratos::IterVar::fix_width(Var **var,uint32_t target_width)

{
  VarType VVar1;
  Const *this;
  InternalException *this_00;
  undefined1 local_68 [32];
  _Alloc_hider local_40;
  
  this = (Const *)*var;
  while( true ) {
    if (this == (Const *)0x0) {
      return;
    }
    VVar1 = (this->super_Var).type_;
    if (VVar1 != Expression) break;
    fix_width((Var **)&this->hex_value_,target_width);
    var = (Var **)&(this->hex_value_)._M_string_length;
    this = (Const *)(this->hex_value_)._M_string_length;
  }
  if ((VVar1 == ConstValue) || (VVar1 == Parameter)) {
    Const::set_width(this,target_width);
    return;
  }
  if (VVar1 != Iter) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    (**(code **)(*(long *)*var + 0x100))(&stack0xffffffffffffffb8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "Unable to fix width for ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb8);
    InternalException::InternalException(this_00,(string *)local_68);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  Var::cast((Var *)&stack0xffffffffffffffb8,(VarCastType)this);
  Var::as<kratos::VarCasted>((Var *)local_68);
  if ((pointer)local_40._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_p);
  }
  VarCasted::set_target_width((VarCasted *)local_68._0_8_,target_width);
  *var = (Var *)local_68._0_8_;
  if ((pointer)local_68._8_8_ == (pointer)0x0) {
    return;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  return;
}

Assistant:

void IterVar::fix_width(Var *&var, uint32_t target_width) {
    if (var && var->type() == VarType::Iter) {
        auto *iter = reinterpret_cast<IterVar *>(var);
        auto casted = iter->cast(VarCastType::Resize)->as<VarCasted>();
        casted->set_target_width(target_width);
        var = casted.get();
    } else if (var && var->type() == VarType::ConstValue) {
        auto *c = reinterpret_cast<Const *>(var);
        c->set_width(target_width);
    } else if (var && var->type() == VarType::Parameter) {
        auto *c = reinterpret_cast<Param *>(var);
        c->set_width(target_width);
    } else if (var && var->type() == VarType::Expression) {
        auto *expr = reinterpret_cast<Expr *>(var);
        fix_width(expr->left, target_width);
        fix_width(expr->right, target_width);
    } else {
        // LCOV_EXCL_START
        if (var) {
            throw InternalException("Unable to fix width for " + var->handle_name());
        }
        // LCOV_EXCL_STOP
    }
}